

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::bitfield_insert_invalid_bits_type
               (NegativeTestContext *ctx)

{
  ShaderType SVar1;
  NegativeTestContext *pNVar2;
  bool bVar3;
  char *__s;
  undefined1 *in_stack_fffffffffffffe80;
  string local_118;
  undefined1 local_f8 [8];
  string shaderSource_1;
  undefined1 local_b8 [8];
  string shaderSource;
  int local_90;
  int dataTypeNdx2;
  int dataTypeNdx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  int local_48;
  int shaderNdx;
  allocator<char> local_31;
  string local_30;
  NegativeTestContext *local_10;
  NegativeTestContext *ctx_local;
  
  local_10 = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"bitfieldInsert: Invalid bits type.",&local_31);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  for (local_48 = 0; local_48 < 6; local_48 = local_48 + 1) {
    bVar3 = NegativeTestContext::isShaderSupported
                      (local_10,*(ShaderType *)
                                 ((anonymous_namespace)::s_shaders + (long)local_48 * 4));
    pNVar2 = local_10;
    if (bVar3) {
      __s = glu::getShaderTypeName
                      (*(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&dataTypeNdx,__s,(allocator<char> *)((long)&dataTypeNdx2 + 3));
      std::operator+(&local_68,"Verify shader: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &dataTypeNdx);
      NegativeTestContext::beginSection(pNVar2,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&dataTypeNdx);
      std::allocator<char>::~allocator((allocator<char> *)((long)&dataTypeNdx2 + 3));
      for (local_90 = 0; local_90 < 4; local_90 = local_90 + 1) {
        for (shaderSource.field_2._12_4_ = 0; (int)shaderSource.field_2._12_4_ < 0xb;
            shaderSource.field_2._12_4_ = shaderSource.field_2._12_4_ + 1) {
          (anonymous_namespace)::genShaderSourceBitfieldInsert_abi_cxx11_
                    ((string *)local_b8,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),
                     *(ShaderType *)((anonymous_namespace)::s_intTypes + (long)local_90 * 4),
                     *(ShaderType *)((anonymous_namespace)::s_intTypes + (long)local_90 * 4),
                     TYPE_INT,*(DataType *)
                               ((anonymous_namespace)::s_nonScalarIntTypes +
                               (long)(int)shaderSource.field_2._12_4_ * 4),
                     (DataType)in_stack_fffffffffffffe80);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_1.field_2._M_local_buf + 8),(string *)local_b8);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_1.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_1.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_b8);
          in_stack_fffffffffffffe80 = (anonymous_namespace)::s_shaders;
          (anonymous_namespace)::genShaderSourceBitfieldInsert_abi_cxx11_
                    ((string *)local_f8,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),
                     *(ShaderType *)((anonymous_namespace)::s_uintTypes + (long)local_90 * 4),
                     *(ShaderType *)((anonymous_namespace)::s_uintTypes + (long)local_90 * 4),
                     TYPE_INT,*(DataType *)
                               ((anonymous_namespace)::s_nonScalarIntTypes +
                               (long)(int)shaderSource.field_2._12_4_ * 4),0xf65050);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)(in_stack_fffffffffffffe80 + (long)local_48 * 4);
          std::__cxx11::string::string((string *)&local_118,(string *)local_f8);
          verifyShader(pNVar2,SVar1,&local_118);
          std::__cxx11::string::~string((string *)&local_118);
          std::__cxx11::string::~string((string *)local_f8);
        }
      }
      NegativeTestContext::endSection(local_10);
    }
  }
  NegativeTestContext::endSection(local_10);
  return;
}

Assistant:

void bitfield_insert_invalid_bits_type (NegativeTestContext& ctx)
{
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_intTypes) == DE_LENGTH_OF_ARRAY(s_uintTypes));

	ctx.beginSection("bitfieldInsert: Invalid bits type.");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_intTypes); ++dataTypeNdx)
			{
				for (int dataTypeNdx2 = 0; dataTypeNdx2 < DE_LENGTH_OF_ARRAY(s_nonScalarIntTypes); ++dataTypeNdx2)
				{
					{
						const std::string shaderSource(genShaderSourceBitfieldInsert(ctx, s_shaders[shaderNdx], s_intTypes[dataTypeNdx], s_intTypes[dataTypeNdx], glu::TYPE_INT, s_nonScalarIntTypes[dataTypeNdx2]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceBitfieldInsert(ctx, s_shaders[shaderNdx], s_uintTypes[dataTypeNdx], s_uintTypes[dataTypeNdx], glu::TYPE_INT, s_nonScalarIntTypes[dataTypeNdx2]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}